

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_file(ConstPtr *image,string *filename)

{
  string *__return_storage_ptr__;
  bool bVar1;
  Exception *this;
  undefined1 local_78 [8];
  string fext4;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_38;
  allocator local_21;
  
  __return_storage_ptr__ = (string *)((long)&fext4.field_2 + 8);
  util::string::right(__return_storage_ptr__,filename,4);
  util::string::lowercase((string *)local_78,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)(fext4.field_2._M_local_buf + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,".pfm");
  if (bVar1) {
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    save_pfm_file((ConstPtr *)&local_38,filename);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__cxx11::string::~string((string *)local_78);
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)(fext4.field_2._M_local_buf + 8),"Output filetype not supported",&local_21);
  util::Exception::Exception(this,(string *)((long)&fext4.field_2 + 8));
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
save_file (FloatImage::ConstPtr image, std::string const& filename)
{

    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    if (fext4 == ".pfm")
    {
        save_pfm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}